

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_octdec(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pValue;
  char *zSrc;
  char **in_RCX;
  jx9_int64 iValue;
  jx9_int64 iVal;
  int nLen;
  
  if (nArg < 1) {
    jx9_result_int(pCtx,-1);
  }
  else {
    iVal = 0;
    pValue = *apArg;
    if ((pValue->iFlags & 1) == 0) {
      iVal = jx9_value_to_int64(pValue);
      iValue = iVal;
    }
    else {
      zSrc = jx9_value_to_string(pValue,&nLen);
      if (nLen < 1) {
        iValue = 0;
      }
      else {
        SyOctalStrToInt64(zSrc,nLen,&iVal,in_RCX);
        iValue = iVal;
      }
    }
    jx9_result_int64(pCtx,iValue);
  }
  return 0;
}

Assistant:

static int jx9Builtin_octdec(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString;
	jx9_int64 iVal;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return -1 */
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	iVal = 0;
	if( jx9_value_is_string(apArg[0]) ){
		/* Extract the given string */
		zString = jx9_value_to_string(apArg[0], &nLen);
		if( nLen > 0 ){
			/* Perform the cast */
			SyOctalStrToInt64(zString, (sxu32)nLen, (void *)&iVal, 0);
		}
	}else{
		/* Extract as a 64-bit integer */
		iVal = jx9_value_to_int64(apArg[0]);
	}
	/* Return the number */
	jx9_result_int64(pCtx, iVal);
	return JX9_OK;
}